

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  char *zIntArray;
  long lVar1;
  int iVar2;
  Table *pTab;
  undefined1 local_c8 [8];
  Index fakeIdx;
  int nCol;
  tRowcnt *aiRowEst;
  char *z;
  Table *pTable;
  Index *pIndex;
  analysisInfo *pInfo;
  char **NotUsed_local;
  char **argv_local;
  int argc_local;
  void *pData_local;
  
  if ((((argv != (char **)0x0) && (*argv != (char *)0x0)) && (argv[2] != (char *)0x0)) &&
     (pTab = sqlite3FindTable(*pData,*argv,*(char **)((long)pData + 8)), pTab != (Table *)0x0)) {
    if (argv[1] == (char *)0x0) {
      pTable = (Table *)0x0;
    }
    else {
      iVar2 = sqlite3_stricmp(*argv,argv[1]);
      if (iVar2 == 0) {
        pTable = (Table *)sqlite3PrimaryKeyIndex(pTab);
      }
      else {
        pTable = (Table *)sqlite3FindIndex(*pData,argv[1],*(char **)((long)pData + 8));
      }
    }
    zIntArray = argv[2];
    if (pTable == (Table *)0x0) {
      fakeIdx.aColExpr._4_2_ = pTab->szTabRow;
      decodeIntArray(zIntArray,1,(tRowcnt *)0x0,&pTab->nRowLogEst,(Index *)local_c8);
      pTab->szTabRow = fakeIdx.aColExpr._4_2_;
      pTab->tabFlags = pTab->tabFlags | 0x10;
    }
    else {
      fakeIdx._100_4_ = *(ushort *)((long)&pTable->azModuleArg + 6) + 1;
      *(byte *)((long)&pTable->pVTable + 3) = *(byte *)((long)&pTable->pVTable + 3) & 0xfb;
      decodeIntArray(zIntArray,fakeIdx._100_4_,(tRowcnt *)0x0,(LogEst *)pTable->pIndex,
                     (Index *)pTable);
      *(byte *)((long)&pTable->pVTable + 3) = *(byte *)((long)&pTable->pVTable + 3) & 0x7f | 0x80;
      lVar1._0_2_ = pTable->nRowLogEst;
      lVar1._2_2_ = pTable->szTabRow;
      lVar1._4_1_ = pTable->keyConf;
      lVar1._5_3_ = *(undefined3 *)&pTable->field_0x4d;
      if (lVar1 == 0) {
        pTab->nRowLogEst = *(LogEst *)&pTable->pIndex->zName;
        pTab->tabFlags = pTab->tabFlags | 0x10;
      }
    }
  }
  return 0;
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1]==0 ){
    pIndex = 0;
  }else if( sqlite3_stricmp(argv[0],argv[1])==0 ){
    pIndex = sqlite3PrimaryKeyIndex(pTable);
  }else{
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }
  z = argv[2];

  if( pIndex ){
    tRowcnt *aiRowEst = 0;
    int nCol = pIndex->nKeyCol+1;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    /* Index.aiRowEst may already be set here if there are duplicate 
    ** sqlite_stat1 entries for this index. In that case just clobber
    ** the old data with the new instead of allocating a new array.  */
    if( pIndex->aiRowEst==0 ){
      pIndex->aiRowEst = (tRowcnt*)sqlite3MallocZero(sizeof(tRowcnt) * nCol);
      if( pIndex->aiRowEst==0 ) sqlite3OomFault(pInfo->db);
    }
    aiRowEst = pIndex->aiRowEst;
#endif
    pIndex->bUnordered = 0;
    decodeIntArray((char*)z, nCol, aiRowEst, pIndex->aiRowLogEst, pIndex);
    pIndex->hasStat1 = 1;
    if( pIndex->pPartIdxWhere==0 ){
      pTable->nRowLogEst = pIndex->aiRowLogEst[0];
      pTable->tabFlags |= TF_HasStat1;
    }
  }else{
    Index fakeIdx;
    fakeIdx.szIdxRow = pTable->szTabRow;
#ifdef SQLITE_ENABLE_COSTMULT
    fakeIdx.pTable = pTable;
#endif
    decodeIntArray((char*)z, 1, 0, &pTable->nRowLogEst, &fakeIdx);
    pTable->szTabRow = fakeIdx.szIdxRow;
    pTable->tabFlags |= TF_HasStat1;
  }

  return 0;
}